

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O3

Data2D<int> * __thiscall
TasGrid::GridWavelet::buildUpdateMap
          (Data2D<int> *__return_storage_ptr__,GridWavelet *this,double tolerance,
          TypeRefinement criteria,int output)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  bool bVar6;
  size_t sVar7;
  pointer pdVar8;
  size_t sVar9;
  pointer pdVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  pointer piVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  Data2D<int> indexes;
  vector<double,_std::allocator<double>_> norm;
  Data2D<double> vals;
  SplitDirections split;
  GridWavelet direction_grid;
  vector<int,_std::allocator<int>_> local_2e8;
  vector<double,_std::allocator<double>_> local_2d0;
  Data2D<double> local_2b8;
  pointer local_290;
  Data2D<int> *local_288;
  long local_280;
  MultiIndexSet local_278;
  SplitDirections local_250;
  undefined1 local_220 [216];
  size_t local_148;
  pointer local_138;
  
  iVar20 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar7 = (size_t)iVar20;
  sVar15 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_250.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = -(uint)(tolerance == 0.0) & 1;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_220,sVar15 * sVar7,
             (value_type_conflict3 *)&local_250,(allocator_type *)&local_2b8);
  __return_storage_ptr__->stride = sVar15;
  __return_storage_ptr__->num_strips = sVar7;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_220._0_8_;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_220._8_8_;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_220._16_8_;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_290 = (pointer)local_220._16_8_;
    getNormalization(&local_2d0,this);
    auVar4 = _DAT_001ca0b0;
    auVar3 = _DAT_001ca070;
    auVar2 = _DAT_001ca060;
    if (criteria < refine_direction_selective) {
      if (0 < iVar20) {
        sVar1 = (this->coefficients).stride;
        pdVar8 = (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        piVar14 = (pointer)(local_220._0_8_ + 0xc);
        sVar9 = 0;
        pdVar10 = pdVar8;
        do {
          if (output == -1) {
            lVar11 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (lVar11 != 0) {
              bVar6 = true;
              lVar16 = 0;
              do {
                if ((bVar6) &&
                   (tolerance <
                    ABS(pdVar10[lVar16]) /
                    local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar16])) {
                  bVar6 = false;
                }
                lVar16 = lVar16 + 1;
              } while (lVar11 != lVar16);
              if (!bVar6) goto LAB_0016f7c8;
            }
          }
          else if (tolerance <
                   ABS(pdVar8[sVar1 * sVar9 + (long)output]) /
                   local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[output]) {
LAB_0016f7c8:
            lVar11 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
            if (lVar11 != 0) {
              uVar12 = lVar11 + 0x3fffffffffffffff;
              uVar17 = uVar12 & 0x3fffffffffffffff;
              auVar19._8_4_ = (int)uVar17;
              auVar19._0_8_ = uVar17;
              auVar19._12_4_ = (int)(uVar17 >> 0x20);
              auVar19 = auVar19 ^ auVar2;
              lVar11 = 0;
              do {
                auVar21._8_4_ = (int)lVar11;
                auVar21._0_8_ = lVar11;
                auVar21._12_4_ = (int)((ulong)lVar11 >> 0x20);
                auVar22 = (auVar21 | auVar3) ^ auVar2;
                iVar20 = auVar19._4_4_;
                if ((bool)(~(iVar20 < auVar22._4_4_ ||
                            auVar19._0_4_ < auVar22._0_4_ && auVar22._4_4_ == iVar20) & 1)) {
                  piVar14[lVar11 + -3] = 1;
                }
                if (auVar22._12_4_ <= auVar19._12_4_ &&
                    (auVar22._8_4_ <= auVar19._8_4_ || auVar22._12_4_ != auVar19._12_4_)) {
                  piVar14[lVar11 + -2] = 1;
                }
                auVar21 = (auVar21 | auVar4) ^ auVar2;
                iVar23 = auVar21._4_4_;
                if (iVar23 <= iVar20 && (iVar23 != iVar20 || auVar21._0_4_ <= auVar19._0_4_)) {
                  piVar14[lVar11 + -1] = 1;
                  piVar14[lVar11] = 1;
                }
                lVar11 = lVar11 + 4;
              } while ((uVar17 - ((uint)uVar12 & 3)) + 4 != lVar11);
            }
          }
          sVar9 = sVar9 + 1;
          pdVar10 = pdVar10 + sVar1;
          piVar14 = piVar14 + sVar15;
        } while (sVar9 != sVar7);
      }
    }
    else {
      HierarchyManipulations::SplitDirections::SplitDirections
                (&local_250,&(this->super_BaseCanonicalGrid).points);
      if (0 < (int)((ulong)((long)local_250.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_250.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        lVar11 = 0;
        local_288 = __return_storage_ptr__;
        do {
          iVar20 = 1;
          if (output == -1) {
            iVar20 = (this->super_BaseCanonicalGrid).num_outputs;
          }
          piVar14 = local_250.job_pnts.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          iVar23 = *(int *)(CONCAT44(local_250.job_directions.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     (uint)local_250.job_directions.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start) + lVar11 * 4);
          local_2b8.stride = (size_t)iVar20;
          uVar13 = (uint)((ulong)((long)local_250.job_pnts.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar14) >> 2);
          sVar7 = (size_t)(int)uVar13;
          local_2b8.num_strips = sVar7;
          local_280 = lVar11;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_2b8.vec,local_2b8.stride * sVar7,(allocator_type *)local_220);
          lVar11 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
          ::std::vector<int,_std::allocator<int>_>::vector
                    (&local_2e8,sVar7 * lVar11,(allocator_type *)local_220);
          if (0 < (int)uVar13) {
            uVar12 = 0;
            do {
              pdVar8 = (this->super_BaseCanonicalGrid).values.values.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start +
                       (long)piVar14[uVar12] * (this->super_BaseCanonicalGrid).values.num_outputs;
              if (output == -1) {
                lVar16 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (lVar16 != 0) {
                  memmove(local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + local_2b8.stride * uVar12,pdVar8,
                          lVar16 << 3);
                }
              }
              else {
                local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[local_2b8.stride * uVar12] = pdVar8[output];
              }
              lVar16 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
              if (0 < lVar16) {
                memmove(local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar11 * uVar12,
                        (this->super_BaseCanonicalGrid).points.indexes.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        (long)piVar14[uVar12] *
                        (this->super_BaseCanonicalGrid).points.num_dimensions,lVar16 << 2);
              }
              uVar12 = uVar12 + 1;
            } while ((uVar13 & 0x7fffffff) != uVar12);
          }
          local_278.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_278.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_278.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_278.num_dimensions = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
          local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_278.cache_num_indexes =
               (int)((ulong)((long)local_278.indexes.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_278.indexes.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2) /
                    local_278.num_dimensions);
          GridWavelet((GridWavelet *)local_220,(this->super_BaseCanonicalGrid).acceleration,
                      &local_278,iVar20,this->order,&local_2b8);
          if (local_278.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_278.indexes.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.indexes.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (0 < (int)uVar13) {
            sVar7 = (this->coefficients).stride;
            pdVar8 = (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar12 = 0;
            pdVar10 = local_138;
            do {
              lVar11 = sVar7 * (long)piVar14[uVar12];
              if (output == -1) {
                lVar16 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (lVar16 < 1) {
                  uVar5 = 0;
                }
                else {
                  bVar6 = true;
                  lVar18 = 0;
                  do {
                    if (((bVar6) &&
                        (tolerance <
                         ABS(pdVar8[lVar11 + lVar18]) /
                         local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18])) &&
                       (tolerance <
                        ABS(pdVar10[lVar18]) /
                        local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar18])) {
                      bVar6 = false;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar16 != lVar18);
                  uVar5 = (uint)(~bVar6 & 1);
                }
              }
              else {
                uVar5 = 0;
                if ((tolerance <
                     ABS(pdVar8[lVar11 + output]) /
                     local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output]) &&
                   (uVar5 = 0,
                   tolerance <
                   ABS(local_138[local_148 * uVar12]) /
                   local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[output])) {
                  uVar5 = 1;
                }
              }
              *(uint *)(local_220._0_8_ + (long)piVar14[uVar12] * sVar15 * 4 + (long)iVar23 * 4) =
                   uVar5;
              uVar12 = uVar12 + 1;
              pdVar10 = pdVar10 + local_148;
            } while (uVar12 != (uVar13 & 0x7fffffff));
          }
          ~GridWavelet((GridWavelet *)local_220);
          if (local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          __return_storage_ptr__ = local_288;
          if (local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar11 = local_280 + 1;
        } while (lVar11 < (int)((ulong)((long)local_250.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_250.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_250);
    }
    if (local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridWavelet::buildUpdateMap(double tolerance, TypeRefinement criteria, int output) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        // classic refinement
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = coefficients.getStrip(i);
            if (output == -1){
                for(size_t k=0; k<((size_t) num_outputs); k++){
                    if (small && ((std::abs(s[k]) / norm[k]) > tolerance)) small = false;
                }
            }else{
                small = !((std::abs(s[output]) / norm[output]) > tolerance);
            }
            if (!small){
                int *p = pmap.getStrip(i);
                std::fill(p, p + num_dimensions, 1);
            }
        }
    }else{
        HierarchyManipulations::SplitDirections split(points);

        for(int s=0; s<split.getNumJobs(); s++){
            int d = split.getJobDirection(s);
            int nump = split.getJobNumPoints(s);
            const int *pnts = split.getJobPoints(s);

            int active_outputs = (output == -1) ? num_outputs : 1;

            Data2D<double> vals(active_outputs, nump);
            Data2D<int> indexes(num_dimensions, nump);

            for(int i=0; i<nump; i++){
                const double* v = values.getValues(pnts[i]);
                double *vls = vals.getStrip(i);
                if (output == -1){
                    std::copy(v, v + num_outputs, vls);
                }else{
                    vls[0] = v[output];
                }
                std::copy_n(points.getIndex(pnts[i]), num_dimensions, indexes.getStrip(i));
            }

            GridWavelet direction_grid(acceleration, {(size_t) num_dimensions, indexes.release()}, active_outputs, order, std::move(vals));

            for(int i=0; i<nump; i++){
                bool small = true;
                const double *coeff = direction_grid.coefficients.getStrip(i);
                const double *soeff = coefficients.getStrip(pnts[i]);
                if (output == -1){
                    for(int k=0; k<num_outputs; k++){
                        if (small && ((std::abs(soeff[k]) / norm[k]) > tolerance) && ((std::abs(coeff[k]) / norm[k]) > tolerance)) small = false;
                    }
                }else{
                    if (((std::abs(soeff[output]) / norm[output]) > tolerance) && ((std::abs(coeff[0]) / norm[output]) > tolerance)) small = false;
                }
                pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;
            }
        }
    }
    return pmap;
}